

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void Search::end_pass(search *sch)

{
  search_private *psVar1;
  vw *pvVar2;
  options_i *poVar3;
  uint uVar4;
  ostream *poVar5;
  typed_option<unsigned_int> *this;
  ulong uVar6;
  allocator local_59;
  string local_58;
  string local_38;
  
  psVar1 = sch->priv;
  pvVar2 = psVar1->all;
  psVar1->hit_new_pass = true;
  uVar6 = psVar1->passes_since_new_policy + 1;
  psVar1->passes_since_new_policy = uVar6;
  psVar1->read_example_last_pass = psVar1->read_example_last_pass + 1;
  if (psVar1->passes_per_policy <= uVar6) {
    psVar1->passes_since_new_policy = 0;
    uVar4 = psVar1->current_policy;
    if (pvVar2->training == true) {
      uVar4 = uVar4 + 1;
      psVar1->current_policy = uVar4;
    }
    if (psVar1->total_number_of_policies < uVar4) {
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "internal error (bug): too many policies; not advancing");
      std::endl<char,std::char_traits<char>>(poVar5);
      psVar1->current_policy = psVar1->total_number_of_policies;
    }
    poVar3 = pvVar2->options;
    std::__cxx11::string::string((string *)&local_58,"search_trained_nb_policies",&local_59);
    std::__cxx11::to_string(&local_38,psVar1->current_policy);
    (*poVar3->_vptr_options_i[6])(poVar3,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    poVar3 = pvVar2->options;
    std::__cxx11::string::string
              ((string *)&local_58,"search_trained_nb_policies",(allocator *)&local_38);
    this = VW::config::options_i::get_typed_option<unsigned_int>(poVar3,&local_58);
    VW::config::typed_option<unsigned_int>::value(this,psVar1->current_policy);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void end_pass(search& sch)
{
  search_private& priv = *sch.priv;
  vw* all = priv.all;
  priv.hit_new_pass = true;
  priv.read_example_last_pass++;
  priv.passes_since_new_policy++;

  if (priv.passes_since_new_policy >= priv.passes_per_policy)
  {
    priv.passes_since_new_policy = 0;
    if (all->training)
      priv.current_policy++;
    if (priv.current_policy > priv.total_number_of_policies)
    {
      std::cerr << "internal error (bug): too many policies; not advancing" << std::endl;
      priv.current_policy = priv.total_number_of_policies;
    }
    // reset search_trained_nb_policies in options_from_file so it is saved to regressor file later
    // TODO work out a better system to update state that will be saved in the model.
    all->options->replace("search_trained_nb_policies", std::to_string(priv.current_policy));
    all->options->get_typed_option<uint32_t>("search_trained_nb_policies").value(priv.current_policy);
  }
}